

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

void ds_list_iter_destroy(DsListIter **piter)

{
  DsListIter *__ptr;
  DsListIter *iter;
  DsListIter **piter_local;
  
  if (*piter != (DsListIter *)0x0) {
    __ptr = *piter;
    free(__ptr->head);
    free(__ptr);
    *piter = (DsListIter *)0x0;
  }
  return;
}

Assistant:

void ds_list_iter_destroy(DsListIter **piter)
{
    if (*piter)
    {
        DsListIter *iter = *piter;
        free(iter->head);
        free(iter);
        *piter = NULL;
    }
    return;
}